

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O3

void traverse_hplane_sim<PredictionData<float,unsigned_long>,long_double>
               (WorkerForSimilarity *workspace,PredictionData<float,_unsigned_long> *prediction_data
               ,ExtIsoForest *model_outputs,vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,
               size_t curr_tree,bool as_kernel)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  pointer pdVar4;
  size_t *psVar5;
  long lVar6;
  unsigned_long uVar7;
  size_t n;
  ulong *puVar8;
  pointer puVar9;
  ulong uVar10;
  long lVar11;
  pointer pIVar12;
  pointer pIVar13;
  ulong *puVar14;
  pointer puVar15;
  ulong uVar16;
  pointer puVar17;
  ulong uVar18;
  double *pdVar19;
  ulong uVar20;
  size_t i;
  long lVar21;
  double *pdVar22;
  long lVar23;
  size_t sVar24;
  double dVar25;
  double unused;
  double local_58;
  double *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (!interrupt_switch) {
    uVar10 = workspace->st;
    uVar20 = workspace->end;
    if (uVar10 != uVar20) {
      if ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar9 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar17 = puVar9 + uVar10;
        puVar15 = puVar9 + uVar20 + 1;
        if (puVar17 != puVar15) {
          uVar10 = (long)puVar15 - (long)puVar17 >> 3;
          lVar11 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar17,puVar15,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar17,puVar15);
          puVar9 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = workspace->st;
        }
        if (workspace->n_from <= puVar9[uVar10]) {
          return;
        }
        uVar20 = workspace->end;
        if (puVar9[uVar20] < workspace->n_from) {
          return;
        }
      }
      pIVar12 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (pIVar12[curr_tree].hplane_left == 0) {
        pdVar19 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar22 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (as_kernel) {
          if (pdVar19 == pdVar22) {
            pdVar4 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (pdVar4 != (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
              puVar17 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar1 = puVar17 + uVar10;
              uVar16 = (long)((long)puVar17 + (uVar20 * 8 - (long)puVar1) + 8) >> 3;
              puVar14 = puVar1;
              if (0 < (long)uVar16) {
                do {
                  uVar18 = uVar16 >> 1;
                  uVar16 = ~uVar18 + uVar16;
                  puVar8 = puVar14 + uVar18 + 1;
                  if (workspace->n_from <= puVar14[uVar18]) {
                    uVar16 = uVar18;
                    puVar8 = puVar14;
                  }
                  puVar14 = puVar8;
                } while (0 < (long)uVar16);
              }
              uVar16 = ((long)puVar14 - (long)puVar1 >> 3) + uVar10;
              if (uVar10 < uVar16) {
                sVar24 = workspace->n_from;
                do {
                  if (uVar16 <= uVar20) {
                    lVar11 = puVar17[uVar10] * sVar24;
                    uVar18 = uVar16;
                    do {
                      lVar23 = puVar17[uVar18] - sVar24;
                      pdVar4[lVar11 + lVar23] = pdVar4[lVar11 + lVar23] + 1.0;
                      uVar18 = uVar18 + 1;
                    } while (uVar18 <= uVar20);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != uVar16);
              }
            }
          }
          else if (uVar10 < uVar20) {
            puVar17 = (workspace->ix_arr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar11 = (long)pdVar22 - (long)pdVar19 >> 3;
            do {
              uVar16 = puVar17[uVar10];
              uVar10 = uVar10 + 1;
              sVar24 = prediction_data->nrows;
              lVar23 = sVar24 - uVar16;
              uVar18 = uVar10;
              do {
                uVar3 = puVar17[uVar18];
                if (uVar16 < uVar3) {
                  lVar21 = uVar3 + (lVar11 - uVar16) + ~((ulong)((lVar23 + -1) * lVar23) >> 1);
                }
                else {
                  lVar21 = sVar24 - uVar3;
                  lVar21 = ((uVar16 + lVar11) - uVar3) + ~((ulong)((lVar21 + -1) * lVar21) >> 1);
                }
                pdVar19[lVar21] = pdVar19[lVar21] + 1.0;
                uVar18 = uVar18 + 1;
              } while (uVar18 <= uVar20);
            } while (uVar10 != uVar20);
          }
        }
        else {
          if (pdVar19 != pdVar22) {
            psVar5 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar24 = prediction_data->nrows;
            if (workspace->assume_full_distr == false) {
              local_38 = (uVar20 - uVar10) + 1;
              dVar25 = expected_separation_depth<long_double>
                                 ((longdouble)local_38 +
                                  (longdouble)(float)(&DAT_0036e0d8)[local_38 < 0] +
                                  (longdouble)pIVar12[curr_tree].remainder);
            }
            else {
              dVar25 = 3.0;
            }
            increase_comb_counter(psVar5,uVar10,uVar20,sVar24,pdVar19,dVar25);
            return;
          }
          pdVar19 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pdVar19 !=
              (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            psVar5 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar24 = workspace->n_from;
            n = prediction_data->nrows;
            if (workspace->assume_full_distr == false) {
              local_40 = (uVar20 - uVar10) + 1;
              dVar25 = expected_separation_depth<long_double>
                                 ((longdouble)local_40 +
                                  (longdouble)(float)(&DAT_0036e0d8)[local_40 < 0] +
                                  (longdouble)pIVar12[curr_tree].remainder);
            }
            else {
              dVar25 = 3.0;
            }
            increase_comb_counter_in_groups(psVar5,uVar10,uVar20,sVar24,n,pdVar19,dVar25);
            return;
          }
        }
      }
      else {
        if (curr_tree != 0 && !as_kernel) {
          pdVar19 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (pdVar19 ==
              (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pdVar19 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (pdVar19 !=
                (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              increase_comb_counter_in_groups
                        ((workspace->ix_arr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar10,uVar20,workspace->n_from,
                         prediction_data->nrows,pdVar19,-1.0);
            }
          }
          else {
            increase_comb_counter
                      ((workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,uVar10,uVar20,prediction_data->nrows,pdVar19
                       ,-1.0);
          }
        }
        if ((prediction_data->Xc_indptr != (unsigned_long *)0x0) &&
           ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start)) {
          puVar9 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar17 = puVar9 + workspace->st;
          puVar9 = puVar9 + workspace->end + 1;
          if (puVar17 != puVar9) {
            uVar10 = (long)puVar9 - (long)puVar17 >> 3;
            lVar11 = 0x3f;
            if (uVar10 != 0) {
              for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar17,puVar9,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar17);
          }
        }
        pdVar4 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = workspace->end - workspace->st;
        if (pdVar4 != pdVar4 + lVar11 + 1) {
          memset(pdVar4,0,lVar11 * 8 + 8);
        }
        pIVar13 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar12 = pIVar13 + curr_tree;
        puVar17 = *(pointer *)
                   &pIVar13[curr_tree].col_num.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        puVar9 = *(pointer *)
                  ((long)&pIVar13[curr_tree].col_num.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8);
        if (prediction_data->Xc_indptr == (unsigned_long *)0x0 &&
            prediction_data->categ_data == (int *)0x0) {
          if (puVar9 != puVar17) {
            uVar10 = 0;
            do {
              pdVar19 = &local_58;
              if (model_outputs->missing_action != Fail) {
                pdVar19 = (double *)
                          (*(long *)&(pIVar12->fill_val).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar10 * 8);
              }
              add_linear_comb<float>
                        ((workspace->ix_arr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,workspace->st,workspace->end,
                         (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         prediction_data->numeric_data + puVar17[uVar10] * prediction_data->nrows,
                         (double *)
                         (uVar10 * 8 +
                         *(long *)&(pIVar12->coef).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data),0.0,
                         *(double *)
                          (*(long *)&(pIVar12->mean).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar10 * 8),pdVar19,
                         model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
              uVar10 = uVar10 + 1;
              pIVar13 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl
                        .super__Vector_impl_data._M_start;
              pIVar12 = pIVar13 + curr_tree;
              puVar17 = *(pointer *)
                         &pIVar13[curr_tree].col_num.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
            } while (uVar10 < (ulong)((long)*(pointer *)
                                             ((long)&pIVar13[curr_tree].col_num.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 8) - (long)puVar17 >> 3));
          }
        }
        else if (puVar9 != puVar17) {
          lVar21 = 0;
          uVar10 = 0;
          lVar11 = 0;
          lVar23 = 0;
          do {
            iVar2 = *(int *)(*(long *)&(pIVar12->col_type).
                                       super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl
                                       .super__Vector_impl_data + uVar10 * 4);
            if (iVar2 == 0x20) {
              if (model_outputs->cat_split_type == SubSet) {
                pdVar19 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar19 = (double *)
                            (*(long *)&(pIVar12->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar21);
                }
                local_50 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                lVar6 = *(long *)&(pIVar12->cat_coef).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data;
                pdVar22 = *(double **)(lVar6 + lVar11 * 0x18);
                local_48 = lVar23;
                add_linear_comb<long_double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,local_50,
                           prediction_data->categ_data + puVar17[uVar10] * prediction_data->nrows,
                           (int)((ulong)(*(long *)(lVar6 + 8 + lVar11 * 0x18) - (long)pdVar22) >> 3)
                           ,pdVar22,0.0,0,pdVar19,
                           (double *)
                           (lVar11 * 8 +
                           *(long *)&(pIVar12->fill_new).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data),(size_t *)0x0,(size_t *)0x0,
                           model_outputs->new_cat_action,model_outputs->missing_action,SubSet,false)
                ;
                lVar23 = local_48;
              }
              else if (model_outputs->cat_split_type == SingleCateg) {
                pdVar19 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar19 = (double *)
                            (*(long *)&(pIVar12->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar21);
                }
                pdVar22 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                add_linear_comb<long_double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,pdVar22,
                           prediction_data->categ_data + puVar17[uVar10] * prediction_data->nrows,0,
                           (double *)0x0,
                           *(double *)
                            (*(long *)&(pIVar12->fill_new).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar11 * 8),
                           *(int *)(*(long *)&(pIVar12->chosen_cat).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + lVar11 * 4),pdVar19,pdVar22,
                           (size_t *)0x0,(size_t *)0x0,model_outputs->new_cat_action,
                           model_outputs->missing_action,SingleCateg,false);
              }
              lVar11 = lVar11 + 1;
            }
            else if (iVar2 == 0x1f) {
              psVar5 = (workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar19 = (double *)workspace->end;
              if (prediction_data->Xc_indptr == (unsigned_long *)0x0) {
                pdVar22 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar22 = (double *)
                            (*(long *)&(pIVar12->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar21);
                }
                add_linear_comb<float>
                          (psVar5,workspace->st,(size_t)pdVar19,
                           (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           prediction_data->numeric_data + puVar17[uVar10] * prediction_data->nrows,
                           (double *)
                           (lVar23 * 8 +
                           *(long *)&(pIVar12->coef).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data),0.0,
                           *(double *)
                            (*(long *)&(pIVar12->mean).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar23 * 8),pdVar22,
                           model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
              }
              else {
                pdVar22 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar22 = (double *)
                            (*(long *)&(pIVar12->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar21);
                }
                local_50 = pdVar19;
                local_48 = lVar11;
                add_linear_comb<float,unsigned_long>
                          (psVar5,workspace->st,(size_t)pdVar19,puVar17[uVar10],
                           (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start,prediction_data->Xc,
                           prediction_data->Xc_ind,prediction_data->Xc_indptr,
                           (double *)
                           (lVar23 * 8 +
                           *(long *)&(pIVar12->coef).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data),0.0,
                           *(double *)
                            (*(long *)&(pIVar12->mean).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar23 * 8),pdVar22,
                           model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
                lVar11 = local_48;
              }
              lVar23 = lVar23 + 1;
            }
            uVar10 = uVar10 + 1;
            pIVar13 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pIVar12 = pIVar13 + curr_tree;
            puVar17 = *(pointer *)
                       &pIVar13[curr_tree].col_num.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
            lVar21 = lVar21 + 8;
          } while (uVar10 < (ulong)((long)*(pointer *)
                                           ((long)&pIVar13[curr_tree].col_num.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 8) - (long)puVar17 >> 3));
        }
        uVar10 = workspace->st;
        sVar24 = workspace->end;
        if (uVar10 <= sVar24) {
          puVar17 = (workspace->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar19 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar25 = pIVar13[curr_tree].split_point;
          uVar20 = uVar10;
          do {
            if (*pdVar19 <= dVar25) {
              uVar7 = puVar17[uVar20];
              puVar17[uVar20] = puVar17[uVar10];
              puVar17[uVar10] = uVar7;
              uVar20 = uVar20 + 1;
            }
            uVar10 = uVar10 + 1;
            pdVar19 = pdVar19 + 1;
          } while (uVar10 <= sVar24);
          sVar24 = workspace->end;
          uVar10 = uVar20;
          if (workspace->st < uVar20) {
            workspace->end = uVar20 - 1;
            traverse_hplane_sim<PredictionData<float,unsigned_long>,long_double>
                      (workspace,prediction_data,model_outputs,hplanes,
                       pIVar13[curr_tree].hplane_left,as_kernel);
          }
        }
        if (uVar10 <= sVar24) {
          workspace->st = uVar10;
          workspace->end = sVar24;
          traverse_hplane_sim<PredictionData<float,unsigned_long>,long_double>
                    (workspace,prediction_data,model_outputs,hplanes,
                     (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                     super__Vector_impl_data._M_start[curr_tree].hplane_right,as_kernel);
        }
      }
    }
  }
  return;
}

Assistant:

void traverse_hplane_sim(WorkerForSimilarity     &workspace,
                         PredictionData          &prediction_data,
                         ExtIsoForest            &model_outputs,
                         std::vector<IsoHPlane>  &hplanes,
                         size_t                  curr_tree,
                         const bool              as_kernel)
{
    if (interrupt_switch)
        return;
    
    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (hplanes[curr_tree].hplane_left == 0)
    {
        if (!as_kernel)
        {
            if (!workspace.tmat_sep.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.assume_full_distr? 3. : 
                                      expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                  + (ldouble_safe)(workspace.end - workspace.st + 1))
                                      );
            else if (!workspace.rmat.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                                prediction_data.nrows, workspace.rmat.data(),
                                                workspace.assume_full_distr? 3. : 
                                                expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                            + (ldouble_safe)(workspace.end - workspace.st + 1))
                                                );
        }

        else
        {
            if (!workspace.tmat_sep.empty())
            {
                size_t i_, j_;
                for (size_t i = workspace.st; i < workspace.end; i++)
                {
                    i_ = workspace.ix_arr[i];
                    for (size_t j = i + 1; j <= workspace.end; j++)
                    {
                        j_ = workspace.ix_arr[j];
                        workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                    }
                }
            }

            else if (!workspace.rmat.empty())
            {
                size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                               std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                workspace.ix_arr.begin() + workspace.end + 1,
                                                                workspace.n_from));
                double *restrict rmat_this;
                for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                {
                    rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                    for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                    {
                        rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
            increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                  prediction_data.nrows, workspace.tmat_sep.data(), -1.);
        else if (!workspace.rmat.empty())
            increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                            prediction_data.nrows, workspace.rmat.data(), -1.);
    }

    if (prediction_data.Xc_indptr != NULL && workspace.tmat_sep.size())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    /* reconstruct linear combination */
    size_t ncols_numeric = 0;
    size_t ncols_categ   = 0;
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0);
    double unused;
    if (prediction_data.categ_data != NULL || prediction_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch(hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    if (prediction_data.Xc_indptr == NULL)
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                        prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    else
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                        hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                        prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    switch(model_outputs.cat_split_type)
                    {
                        case SingleCateg:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int)0, NULL, hplanes[curr_tree].fill_new[ncols_categ],
                                            hplanes[curr_tree].chosen_cat[ncols_categ],
                                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                            workspace.comb_val[0], NULL, NULL, model_outputs.new_cat_action,
                                            model_outputs.missing_action, SingleCateg, false);
                            break;
                        }

                        case SubSet:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int) hplanes[curr_tree].cat_coef[ncols_categ].size(),
                                            hplanes[curr_tree].cat_coef[ncols_categ].data(), (double) 0, (int) 0,
                                            (model_outputs.missing_action == Fail)? unused : hplanes[curr_tree].fill_val[col],
                                            hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                            model_outputs.new_cat_action, model_outputs.missing_action, SubSet, false);
                            break;
                        }
                    }
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            } 
        }
    }

    
    else /* faster version for numerical-only */
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                            prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_left,
                            as_kernel);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_right,
                            as_kernel);
    }

}